

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnpc-c++.c++
# Opt level: O1

CppTypeName * __thiscall
capnp::anon_unknown_1::CppTypeName::makeTemplateParam
          (CppTypeName *__return_storage_ptr__,CppTypeName *this,StringPtr name)

{
  StringTree local_58;
  CppTypeName *local_20;
  ArrayPtr<const_char> *local_18;
  
  local_18 = (ArrayPtr<const_char> *)(name.content.ptr + -1);
  local_20 = this;
  kj::StringTree::concat<kj::ArrayPtr<char_const>>
            (&local_58,(StringTree *)&stack0xffffffffffffffe0,local_18);
  (__return_storage_ptr__->name).size_ = local_58.size_;
  (__return_storage_ptr__->name).text.content.ptr = local_58.text.content.ptr;
  (__return_storage_ptr__->name).text.content.size_ = local_58.text.content.size_;
  (__return_storage_ptr__->name).text.content.disposer = local_58.text.content.disposer;
  (__return_storage_ptr__->name).branches.ptr = local_58.branches.ptr;
  (__return_storage_ptr__->name).branches.size_ = local_58.branches.size_;
  (__return_storage_ptr__->name).branches.disposer = local_58.branches.disposer;
  __return_storage_ptr__->isArgDependent = true;
  __return_storage_ptr__->needsTypename = false;
  __return_storage_ptr__->hasInterfaces_ = false;
  __return_storage_ptr__->hasDisambiguatedTemplate_ = false;
  return __return_storage_ptr__;
}

Assistant:

static CppTypeName makeTemplateParam(kj::StringPtr name) {
    return CppTypeName(kj::strTree(name), true);
  }